

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall cmMakefile::PlatformIs32Bit(cmMakefile *this)

{
  bool bVar1;
  int iVar2;
  cmValue cVar3;
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"CMAKE_INTERNAL_PLATFORM_ABI",&local_31);
  cVar3 = GetDefinition(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  if ((cVar3.Value == (string *)0x0) || (bVar1 = std::operator==(cVar3.Value,"ELF X32"), !bVar1)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"CMAKE_SIZEOF_VOID_P",&local_31);
    cVar3 = GetDefinition(this,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    if (cVar3.Value != (string *)0x0) {
      iVar2 = atoi(((cVar3.Value)->_M_dataplus)._M_p);
      return iVar2 == 4;
    }
  }
  return false;
}

Assistant:

bool cmMakefile::PlatformIs32Bit() const
{
  if (cmValue plat_abi = this->GetDefinition("CMAKE_INTERNAL_PLATFORM_ABI")) {
    if (*plat_abi == "ELF X32") {
      return false;
    }
  }
  if (cmValue sizeof_dptr = this->GetDefinition("CMAKE_SIZEOF_VOID_P")) {
    return atoi(sizeof_dptr->c_str()) == 4;
  }
  return false;
}